

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O3

uint32_t spvtools::opt::anon_unknown_0::PerformOperation
                   (ConstantManager *const_mgr,Op opcode,Constant *input1,Constant *input2)

{
  Type *pTVar1;
  int iVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Constant *input2_00;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Constant *pCVar6;
  Instruction *this;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  uint uVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  uint local_7c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  Type *local_40;
  long local_38;
  long lVar4;
  
  if ((input1 == (Constant *)0x0) || (input2 == (Constant *)0x0)) {
    __assert_fail("input1 && input2",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x288,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  }
  pTVar1 = input1->type_;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  iVar2 = (*pTVar1->_vptr_Type[0xe])(pTVar1);
  lVar4 = CONCAT44(extraout_var,iVar2);
  if (lVar4 == 0) {
    iVar2 = (*pTVar1->_vptr_Type[0xc])(pTVar1);
    if (CONCAT44(extraout_var_06,iVar2) == 0) {
      iVar2 = (*pTVar1->_vptr_Type[10])(pTVar1);
      if (CONCAT44(extraout_var_07,iVar2) == 0) {
        __assert_fail("type->AsInteger()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                      ,0x2b3,
                      "uint32_t spvtools::opt::(anonymous namespace)::PerformOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                     );
      }
      uVar3 = PerformIntegerOperation(const_mgr,opcode,input1,input2);
    }
    else {
      uVar3 = PerformFloatingPointOperation(const_mgr,opcode,input1,input2);
    }
  }
  else {
    local_40 = pTVar1;
    if (*(int *)(lVar4 + 0x30) != 0) {
      pTVar1 = *(Type **)(lVar4 + 0x28);
      uVar7 = 0;
      local_38 = lVar4;
      do {
        local_7c = 0;
        iVar2 = (*input1->_vptr_Constant[0x13])(input1);
        plVar5 = (long *)CONCAT44(extraout_var_00,iVar2);
        if (plVar5 == (long *)0x0) {
          iVar2 = (*input1->_vptr_Constant[0x16])(input1);
          if (CONCAT44(extraout_var_01,iVar2) == 0) {
            __assert_fail("input1->AsNullConstant()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                          ,0x295,
                          "uint32_t spvtools::opt::(anonymous namespace)::PerformOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                         );
          }
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pCVar6 = analysis::ConstantManager::GetConstant(const_mgr,pTVar1,&local_78);
          if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          plVar5 = (long *)(**(code **)(*plVar5 + 0xc0))(plVar5);
          pCVar6 = *(Constant **)(*plVar5 + (ulong)uVar7 * 8);
        }
        iVar2 = (*input2->_vptr_Constant[0x13])(input2);
        plVar5 = (long *)CONCAT44(extraout_var_02,iVar2);
        if (plVar5 == (long *)0x0) {
          iVar2 = (*input2->_vptr_Constant[0x16])(input2);
          if (CONCAT44(extraout_var_03,iVar2) == 0) {
            __assert_fail("input2->AsNullConstant()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                          ,0x29e,
                          "uint32_t spvtools::opt::(anonymous namespace)::PerformOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                         );
          }
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          input2_00 = analysis::ConstantManager::GetConstant(const_mgr,pTVar1,&local_78);
          if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          plVar5 = (long *)(**(code **)(*plVar5 + 0xc0))(plVar5);
          input2_00 = *(Constant **)(*plVar5 + (ulong)uVar7 * 8);
        }
        iVar2 = (*pTVar1->_vptr_Type[0xc])(pTVar1);
        if (CONCAT44(extraout_var_04,iVar2) == 0) {
          iVar2 = (*pTVar1->_vptr_Type[10])(pTVar1);
          if (CONCAT44(extraout_var_05,iVar2) == 0) {
            __assert_fail("ele_type->AsInteger()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                          ,0x2a6,
                          "uint32_t spvtools::opt::(anonymous namespace)::PerformOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                         );
          }
          local_7c = PerformIntegerOperation(const_mgr,opcode,pCVar6,input2_00);
        }
        else {
          local_7c = PerformFloatingPointOperation(const_mgr,opcode,pCVar6,input2_00);
        }
        if (local_7c == 0) {
          uVar3 = 0;
          goto LAB_0020cfcc;
        }
        if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_58,
                     (iterator)
                     local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_7c);
        }
        else {
          *local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_7c;
          local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != *(uint *)(local_38 + 0x30));
    }
    pCVar6 = analysis::ConstantManager::GetConstant(const_mgr,local_40,&local_58);
    uVar3 = 0;
    this = analysis::ConstantManager::GetDefiningInstruction
                     (const_mgr,pCVar6,0,(inst_iterator *)0x0);
    if (this->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(this,(uint)this->has_type_id_);
    }
  }
LAB_0020cfcc:
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return uVar3;
}

Assistant:

uint32_t PerformOperation(analysis::ConstantManager* const_mgr, spv::Op opcode,
                          const analysis::Constant* input1,
                          const analysis::Constant* input2) {
  assert(input1 && input2);
  const analysis::Type* type = input1->type();
  std::vector<uint32_t> words;
  if (const analysis::Vector* vector_type = type->AsVector()) {
    const analysis::Type* ele_type = vector_type->element_type();
    for (uint32_t i = 0; i != vector_type->element_count(); ++i) {
      uint32_t id = 0;

      const analysis::Constant* input1_comp = nullptr;
      if (const analysis::VectorConstant* input1_vector =
              input1->AsVectorConstant()) {
        input1_comp = input1_vector->GetComponents()[i];
      } else {
        assert(input1->AsNullConstant());
        input1_comp = const_mgr->GetConstant(ele_type, {});
      }

      const analysis::Constant* input2_comp = nullptr;
      if (const analysis::VectorConstant* input2_vector =
              input2->AsVectorConstant()) {
        input2_comp = input2_vector->GetComponents()[i];
      } else {
        assert(input2->AsNullConstant());
        input2_comp = const_mgr->GetConstant(ele_type, {});
      }

      if (ele_type->AsFloat()) {
        id = PerformFloatingPointOperation(const_mgr, opcode, input1_comp,
                                           input2_comp);
      } else {
        assert(ele_type->AsInteger());
        id = PerformIntegerOperation(const_mgr, opcode, input1_comp,
                                     input2_comp);
      }
      if (id == 0) return 0;
      words.push_back(id);
    }
    const analysis::Constant* merged_const =
        const_mgr->GetConstant(type, words);
    return const_mgr->GetDefiningInstruction(merged_const)->result_id();
  } else if (type->AsFloat()) {
    return PerformFloatingPointOperation(const_mgr, opcode, input1, input2);
  } else {
    assert(type->AsInteger());
    return PerformIntegerOperation(const_mgr, opcode, input1, input2);
  }
}